

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

void * __thiscall
embree::sse2::GeneralBVHBuilder::
BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:291:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:296:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:322:9)>
::recurse(BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:291:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:296:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:322:9)>
          *this,BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                *current,CachedAllocator alloc,bool toplevel)

{
  PrimInfoExtRange *pPVar1;
  __int_type_conflict _Var2;
  size_t sVar3;
  byte bVar4;
  BVH *pBVar5;
  anon_class_32_4_a8fd484c *paVar6;
  atomic<unsigned_long> *paVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  anon_class_24_3_07848ca9 *paVar10;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  uint uVar11;
  char cVar12;
  int iVar13;
  long *plVar14;
  ThreadLocal2 *this_00;
  void *pvVar15;
  task *ptVar16;
  void *pvVar17;
  ulong extraout_RAX;
  runtime_error *this_01;
  ulong uVar18;
  unsigned_long *puVar19;
  undefined8 *puVar20;
  _func_int **pp_Var21;
  long lVar22;
  _func_int **pp_Var23;
  _func_int **pp_Var24;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *current_00;
  double dVar25;
  undefined1 auVar26 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  small_object_allocator alloc_1;
  void *values [16];
  Split split_1;
  Split split;
  Lock<embree::MutexSys> lock;
  PrimInfoExtRange rprims;
  PrimInfoExtRange lprims;
  small_object_pool *local_a50;
  void **local_a48;
  BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:291:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:296:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:322:9)>
  *local_a40;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *local_a38;
  void *local_a30;
  uint local_a28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a20;
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined1 local_9e0 [16];
  unsigned_long local_9d0;
  void *local_9c0;
  bool local_9b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_9b0;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined4 uStack_978;
  undefined4 uStack_974;
  undefined1 local_970 [16];
  unsigned_long local_960;
  task_group_context local_940;
  Split local_8c0;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_840;
  size_t local_7d0;
  undefined1 local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined4 local_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  undefined1 local_7a0 [16];
  undefined4 local_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined8 local_770;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_140;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [16];
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined8 local_f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  unsigned_long local_a0;
  unsigned_long uStack_98;
  unsigned_long local_90;
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    pBVar5 = *this->createAlloc->bvh;
    plVar14 = (long *)__tls_get_addr(&PTR_02224d38);
    this_00 = (ThreadLocal2 *)*plVar14;
    if (this_00 == (ThreadLocal2 *)0x0) {
      this_00 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys((MutexSys *)this_00);
      (this_00->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_00->alloc0).parent = this_00;
      (this_00->alloc0).ptr = (char *)0x0;
      (this_00->alloc0).cur = 0;
      (this_00->alloc0).end = 0;
      (this_00->alloc0).allocBlockSize = 0;
      (this_00->alloc0).bytesUsed = 0;
      (this_00->alloc0).bytesWasted = 0;
      (this_00->alloc1).parent = this_00;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      *plVar14 = (long)this_00;
      local_840.depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      local_840.alloc_barrier = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_940.my_cpu_ctl_env = (uint64_t)this_00;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&local_940);
      if ((ThreadLocal2 *)local_940.my_cpu_ctl_env != (ThreadLocal2 *)0x0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_940,
                   (ThreadLocal2 *)local_940.my_cpu_ctl_env);
      }
      if (local_840.alloc_barrier == true) {
        MutexSys::unlock((MutexSys *)local_840.depth);
      }
    }
    alloc.talloc0 = &this_00->alloc0;
    alloc.talloc1 = &this_00->alloc1;
    if ((pBVar5->allocator).use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
    alloc.alloc = &pBVar5->allocator;
  }
  if (((toplevel) &&
      (uVar18 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end
                - (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>.
                  _begin, uVar18 <= (this->cfg).singleThreadThreshold)) &&
     (paVar6 = this->progressMonitor, *paVar6->buildProgress != (RTCProgressMonitorFunction)0x0)) {
    paVar7 = paVar6->progress;
    LOCK();
    _Var2 = (paVar7->super___atomic_base<unsigned_long>)._M_i;
    (paVar7->super___atomic_base<unsigned_long>)._M_i =
         (paVar7->super___atomic_base<unsigned_long>)._M_i + uVar18;
    UNLOCK();
    lVar22 = _Var2 + uVar18;
    auVar31._8_4_ = (int)((ulong)lVar22 >> 0x20);
    auVar31._0_8_ = lVar22;
    auVar31._12_4_ = 0x45300000;
    sVar3 = *paVar6->primitiveCount;
    auVar27._8_4_ = (int)(sVar3 >> 0x20);
    auVar27._0_8_ = sVar3;
    auVar27._12_4_ = 0x45300000;
    dVar25 = ((auVar31._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar22) - 4503599627370496.0)) /
             ((auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
    if (1.0 <= dVar25) {
      dVar25 = 1.0;
    }
    (**paVar6->buildProgress)(*paVar6->userPtr,dVar25);
  }
  pPVar1 = &current->prims;
  HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
  ::find(&local_8c0,this->heuristic,pPVar1,(this->cfg).logBlockSize);
  bVar4 = (byte)(this->cfg).logBlockSize;
  uVar8 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  uVar9 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin;
  uVar18 = uVar8 - uVar9;
  if (((uVar18 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) ||
     ((uVar18 <= (this->cfg).maxLeafSize &&
      (fVar29 = (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[1] -
                (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[1],
      fVar30 = (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[2] -
               (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[2],
      fVar30 = (fVar29 + fVar30) *
               ((current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[0] -
               (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[0]) +
               fVar30 * fVar29, fVar29 = (this->cfg).intCost,
      (float)((~(-1L << (bVar4 & 0x3f)) + uVar8) - uVar9 >> (bVar4 & 0x3f)) * fVar30 * fVar29 <=
      fVar30 * (this->cfg).travCost + fVar29 * local_8c0.sah)))) {
    HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
    ::deterministic_order(this->heuristic,pPVar1);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    pvVar15 = createLargeLeaf(this,current,alloc_00);
  }
  else {
    HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
    ::split(this->heuristic,&local_8c0,pPVar1,(PrimInfoExtRange *)&local_e0.field_1,
            (PrimInfoExtRange *)&local_140.field_1);
    local_840.depth = current->depth + 1;
    local_840.alloc_barrier = false;
    local_840.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = local_e0._0_8_;
    local_840.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = local_e0._8_8_;
    local_840.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ = local_d0;
    local_840.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ = uStack_c8;
    local_840.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = local_c0;
    local_840.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = uStack_b8;
    local_840.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ = local_b0;
    local_840.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ = uStack_a8;
    local_840.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin = local_a0
    ;
    local_840.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end = uStack_98;
    local_840.prims.super_extended_range<unsigned_long>._ext_end = local_90;
    local_7d0 = local_840.depth;
    local_7c8 = 0;
    local_7c0 = local_140._0_8_;
    uStack_7b8 = local_140._8_8_;
    local_7b0 = local_130;
    uStack_7ac = uStack_12c;
    uStack_7a8 = uStack_128;
    uStack_7a4 = uStack_124;
    local_7a0 = local_120;
    local_790 = local_110;
    uStack_78c = uStack_10c;
    uStack_788 = uStack_108;
    uStack_784 = uStack_104;
    local_780 = local_100;
    uStack_77c = uStack_fc;
    uStack_778 = uStack_f8;
    uStack_774 = uStack_f4;
    local_770 = local_f0;
    for (pp_Var23 = (_func_int **)0x2; pp_Var23 < (_func_int **)(this->cfg).branchingFactor;
        pp_Var23 = (_func_int **)((long)pp_Var23 + 1)) {
      if (pp_Var23 == (_func_int **)0x0) {
        pp_Var24 = (_func_int **)0xffffffffffffffff;
      }
      else {
        pp_Var24 = (_func_int **)0xffffffffffffffff;
        puVar19 = &local_840.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
                   _end;
        pp_Var21 = (_func_int **)0x0;
        fVar29 = -INFINITY;
        do {
          if (((this->cfg).minLeafSize < *puVar19 - ((range<unsigned_long> *)(puVar19 + -1))->_begin
              ) && (fVar30 = *(float *)((long)puVar19 + -0x34) - *(float *)((long)puVar19 + -0x44),
                   fVar30 = (fVar30 + (*(float *)(puVar19 + -6) - *(float *)(puVar19 + -8))) *
                            (*(float *)(puVar19 + -7) - *(float *)(puVar19 + -9)) +
                            (*(float *)(puVar19 + -6) - *(float *)(puVar19 + -8)) * fVar30,
                   fVar29 < fVar30)) {
            pp_Var24 = pp_Var21;
            fVar29 = fVar30;
          }
          pp_Var21 = (_func_int **)((long)pp_Var21 + 1);
          puVar19 = puVar19 + 0xe;
        } while (pp_Var23 != pp_Var21);
      }
      if (pp_Var24 == (_func_int **)0xffffffffffffffff) break;
      local_a30 = (void *)(current->depth + 1);
      local_9b8 = false;
      local_9b0._0_8_ = 0x7f8000007f800000;
      local_9b0._8_8_ = 0x7f8000007f800000;
      local_9a0 = 0xff800000;
      uStack_99c = 0xff800000;
      uStack_998 = 0xff800000;
      uStack_994 = 0xff800000;
      local_990 = 0x7f8000007f800000;
      uStack_988 = 0x7f8000007f800000;
      local_980 = 0xff800000;
      uStack_97c = 0xff800000;
      uStack_978 = 0xff800000;
      uStack_974 = 0xff800000;
      local_960 = 0;
      local_9e0 = ZEXT816(0);
      local_a28 = local_a28 & 0xffffff00;
      local_a20._0_8_ = 0x7f8000007f800000;
      local_a20._8_8_ = 0x7f8000007f800000;
      local_a10 = 0xff800000;
      uStack_a0c = 0xff800000;
      uStack_a08 = 0xff800000;
      uStack_a04 = 0xff800000;
      local_a00 = 0x7f8000007f800000;
      uStack_9f8 = 0x7f8000007f800000;
      local_9f0 = 0xff800000;
      uStack_9ec = 0xff800000;
      uStack_9e8 = 0xff800000;
      uStack_9e4 = 0xff800000;
      local_9d0 = 0;
      pPVar1 = &(&local_840)[(long)pp_Var24].prims;
      local_9c0 = local_a30;
      local_970 = local_9e0;
      HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
      ::find((Split *)&local_940,this->heuristic,pPVar1,(this->cfg).logBlockSize);
      HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
      ::split(this->heuristic,(Split *)&local_940,pPVar1,(PrimInfoExtRange *)&local_9b0.field_1,
              (PrimInfoExtRange *)&local_a20.field_1);
      (&local_840)[(long)pp_Var24].alloc_barrier = local_9b8;
      (&local_840)[(long)pp_Var24].depth = (size_t)local_9c0;
      *(undefined8 *)&(pPVar1->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_9b0._0_8_;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pp_Var24].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8
       ) = local_9b0._8_8_;
      *(ulong *)&(&local_840)[(long)pp_Var24].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
           CONCAT44(uStack_99c,local_9a0);
      *(ulong *)((long)&(&local_840)[(long)pp_Var24].prims.super_CentGeomBBox3fa.geomBounds.upper.
                        field_0 + 8) = CONCAT44(uStack_994,uStack_998);
      *(undefined8 *)
       &(&local_840)[(long)pp_Var24].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
           local_990;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pp_Var24].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8
       ) = uStack_988;
      *(ulong *)&(&local_840)[(long)pp_Var24].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
           CONCAT44(uStack_97c,local_980);
      *(ulong *)((long)&(&local_840)[(long)pp_Var24].prims.super_CentGeomBBox3fa.centBounds.upper.
                        field_0 + 8) = CONCAT44(uStack_974,uStack_978);
      (&local_840)[(long)pp_Var24].prims.super_extended_range<unsigned_long>._ext_end = local_960;
      (&local_840)[(long)pp_Var24].prims.super_extended_range<unsigned_long>.
      super_range<unsigned_long>._begin = local_970._0_8_;
      (&local_840)[(long)pp_Var24].prims.super_extended_range<unsigned_long>.
      super_range<unsigned_long>._end = local_970._8_8_;
      (&local_840)[(long)pp_Var23].depth = (size_t)local_a30;
      (&local_840)[(long)pp_Var23].alloc_barrier = local_a28._0_1_;
      *(undefined8 *)
       &(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
           local_a20._0_8_;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8
       ) = local_a20._8_8_;
      *(ulong *)&(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
           CONCAT44(uStack_a0c,local_a10);
      *(ulong *)((long)&(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.geomBounds.upper.
                        field_0 + 8) = CONCAT44(uStack_a04,uStack_a08);
      *(undefined8 *)
       &(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
           local_a00;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8
       ) = uStack_9f8;
      *(ulong *)&(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
           CONCAT44(uStack_9ec,local_9f0);
      *(ulong *)((long)&(&local_840)[(long)pp_Var23].prims.super_CentGeomBBox3fa.centBounds.upper.
                        field_0 + 8) = CONCAT44(uStack_9e4,uStack_9e8);
      *(undefined4 *)
       &(&local_840)[(long)pp_Var23].prims.super_extended_range<unsigned_long>.
        super_range<unsigned_long>._begin = local_9e0._0_4_;
      *(undefined4 *)
       ((long)&(&local_840)[(long)pp_Var23].prims.super_extended_range<unsigned_long>.
               super_range<unsigned_long>._begin + 4) = local_9e0._4_4_;
      *(undefined4 *)
       &(&local_840)[(long)pp_Var23].prims.super_extended_range<unsigned_long>.
        super_range<unsigned_long>._end = local_9e0._8_4_;
      *(undefined4 *)
       ((long)&(&local_840)[(long)pp_Var23].prims.super_extended_range<unsigned_long>.
               super_range<unsigned_long>._end + 4) = local_9e0._12_4_;
      (&local_840)[(long)pp_Var23].prims.super_extended_range<unsigned_long>._ext_end = local_9d0;
    }
    if ((((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
          (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
          (this->cfg).primrefarrayalloc) ||
        (BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_5,embree::PrimRef,32ul,16ul>,embree::sse2::PrimInfoExtRange,embree::PrimRef,void*,embree::FastAllocator::CachedAllocator,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_1,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_2,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_3,embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void*,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_4>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_6>
         ::recurse(), (extraout_RAX & 1) == 0)) && (pp_Var23 != (_func_int **)0x0)) {
      lVar22 = 0x3f;
      if (pp_Var23 != (_func_int **)0x0) {
        for (; (ulong)pp_Var23 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      std::
      __introsort_loop<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>>>>
                (&local_840,&local_840 + (long)pp_Var23,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>>>>
                (&local_840,&local_840 + (long)pp_Var23);
    }
    paVar10 = this->createNode;
    uVar11 = (uint)pp_Var23;
    pvVar15 = (**paVar10->createNode)((RTCThreadLocalAllocator)&alloc,uVar11,*paVar10->userPtr);
    if (pp_Var23 != (_func_int **)0x0) {
      lVar22 = (long)pp_Var23 + -1;
      auVar26._8_4_ = (int)lVar22;
      auVar26._0_8_ = lVar22;
      auVar26._12_4_ = (int)((ulong)lVar22 >> 0x20);
      puVar20 = &local_7c0;
      uVar18 = 0;
      auVar26 = auVar26 ^ _DAT_01fec6d0;
      auVar28 = _DAT_01fecaf0;
      do {
        auVar31 = auVar28 ^ _DAT_01fec6d0;
        if ((bool)(~(auVar31._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar31._0_4_ ||
                    auVar26._4_4_ < auVar31._4_4_) & 1)) {
          *(undefined8 **)(local_940.padding + uVar18 * 8 + -0x48) = puVar20 + -0xe;
        }
        if ((auVar31._12_4_ != auVar26._12_4_ || auVar31._8_4_ <= auVar26._8_4_) &&
            auVar31._12_4_ <= auVar26._12_4_) {
          *(undefined8 **)(local_940.padding + uVar18 * 8 + -0x40) = puVar20;
        }
        uVar18 = uVar18 + 2;
        lVar22 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 2;
        auVar28._8_8_ = lVar22 + 2;
        puVar20 = puVar20 + 0x1c;
      } while (((long)pp_Var23 + 1U & 0xfffffffffffffffe) != uVar18);
    }
    (**paVar10->setNodeBounds)(pvVar15,(RTCBounds **)&local_940,uVar11,*paVar10->userPtr);
    if ((this->cfg).singleThreadThreshold <
        (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
        (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
      local_a48 = &local_9c0;
      local_a38 = &local_840;
      local_940.my_version = proxy_support;
      local_940.my_traits = (context_traits)0x4;
      local_940.my_node.my_prev_node = (intrusive_list_node *)0x0;
      local_940.my_node.my_next_node = (intrusive_list_node *)0x0;
      local_940.my_name = CUSTOM_CTX;
      local_a40 = this;
      tbb::detail::r1::initialize(&local_940);
      if (pp_Var23 != (_func_int **)0x0) {
        local_a50 = (small_object_pool *)0x0;
        ptVar16 = (task *)tbb::detail::r1::allocate(&local_a50,0x80);
        ptVar16->m_reserved[3] = 0;
        ptVar16->m_reserved[4] = 0;
        ptVar16->m_reserved[1] = 0;
        ptVar16->m_reserved[2] = 0;
        (ptVar16->super_task_traits).m_version_and_traits = 0;
        ptVar16->m_reserved[0] = 0;
        ptVar16->m_reserved[5] = 0;
        ptVar16->_vptr_task = (_func_int **)&PTR__task_02202540;
        ptVar16[1]._vptr_task = pp_Var23;
        ptVar16[1].super_task_traits.m_version_and_traits = 0;
        ptVar16[1].m_reserved[0] = 1;
        ptVar16[1].m_reserved[1] = (uint64_t)&local_a48;
        iVar13 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
        *(undefined4 *)(ptVar16[1].m_reserved + 4) = 0;
        *(undefined1 *)((long)ptVar16[1].m_reserved + 0x24) = 5;
        ptVar16[1].m_reserved[3] = ((long)iVar13 & 0x3fffffffffffffffU) * 2;
        ptVar16[1].m_reserved[5] = (uint64_t)local_a50;
        local_a30 = (void *)0x0;
        local_a28 = 1;
        local_a20._0_8_ = 1;
        local_a20._8_8_ = 1;
        ptVar16[1].m_reserved[2] = (uint64_t)&local_a30;
        tbb::detail::r1::execute_and_wait
                  (ptVar16,&local_940,(wait_context *)&local_a20.field_1,&local_940);
      }
      cVar12 = tbb::detail::r1::is_group_execution_cancelled(&local_940);
      if (cVar12 != '\0') {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"task cancelled");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy(&local_940);
    }
    else if (pp_Var23 != (_func_int **)0x0) {
      current_00 = &local_840;
      pp_Var24 = (_func_int **)0x0;
      do {
        alloc_01.talloc0 = alloc.talloc0;
        alloc_01.alloc = alloc.alloc;
        alloc_01.talloc1 = alloc.talloc1;
        pvVar17 = recurse(this,current_00,alloc_01,false);
        (&local_9c0)[(long)pp_Var24] = pvVar17;
        pp_Var24 = (_func_int **)((long)pp_Var24 + 1);
        current_00 = current_00 + 1;
      } while (pp_Var23 != pp_Var24);
    }
    (**this->updateNode->setNodeChildren)(pvVar15,&local_9c0,uVar11,*this->updateNode->userPtr);
  }
  return pvVar15;
}

Assistant:

const ReductionTy recurse(BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            auto split = heuristic.find(current.prims,cfg.logBlockSize);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*halfArea(current.prims.geomBounds)+cfg.intCost*split.splitSAH();
            assert((current.prims.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.prims.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.prims.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              heuristic.deterministic_order(current.prims);
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            Set lprims,rprims;
            heuristic.split(split,current.prims,lprims,rprims);
	    
            /*! initialize child list with initial split */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            children[0] = BuildRecord(current.depth+1,lprims);
            children[1] = BuildRecord(current.depth+1,rprims);
            size_t numChildren = 2;

            /*! split until node is full or SAH tells us to stop */
            while (numChildren < cfg.branchingFactor)
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.minLeafSize) continue;

                /* find child with largest surface area */
                if (halfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i;
                  bestArea = halfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              auto split = heuristic.find(brecord.prims,cfg.logBlockSize);
              heuristic.split(split,brecord.prims,lrecord.prims,rrecord.prims);
              children[bestChild  ] = lrecord;
              children[numChildren] = rrecord;
              numChildren++;
            }

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* sort buildrecords for faster shadow ray traversal */
            std::sort(&children[0],&children[numChildren],std::greater<BuildRecord>());

            /*! create an inner node */
            auto node = createNode(children,numChildren,alloc);

            /* spawn tasks */
            if (current.size() > cfg.singleThreadThreshold)
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) { // FIXME: no range here
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              return updateNode(current,children,node,values,numChildren);
            }
            /* recurse into each child */
            else
            {
              for (size_t i=0; i<numChildren; i++)
                values[i] = recurse(children[i],alloc,false);

              return updateNode(current,children,node,values,numChildren);
            }
          }